

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.c
# Opt level: O2

int wwCmpW(word *a,size_t n,word w)

{
  uint uVar1;
  uint uVar2;
  
  if (n == 0) {
    uVar2 = -(uint)(w != 0);
  }
  else {
    uVar1 = wwIsZero(a + 1,n - 1);
    uVar2 = 0xffffffff;
    if (w <= *a) {
      uVar2 = (uint)(w < *a);
    }
    uVar2 = uVar1 ^ 1 | -uVar1 & uVar2;
  }
  return uVar2;
}

Assistant:

int SAFE(wwCmpW)(const word a[], size_t n, register word w)
{
	register int ret;
	ASSERT(wwIsValid(a, n));
	if (n == 0)
		ret = wordEq(w, 0) - 1;
	else
	{
		register int z = wwIsZero(a + 1, n - 1);
		ret = -wordLess(a[0], w) & -1 | -wordGreater(a[0], w) & 1;
		ret = -z & ret | (z - 1) & 1;
		z = 0;
	}
	w = 0;
	return ret;
}